

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndWhileCommand.h
# Opt level: O0

cmCommand * __thiscall cmEndWhileCommand::Clone(cmEndWhileCommand *this)

{
  cmCommand *this_00;
  cmEndWhileCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmEndWhileCommand((cmEndWhileCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmEndWhileCommand;
    }